

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter **rtptrans,int numtrans,
          bool acceptownpackets)

{
  RTPTransmitter **ppRVar1;
  bool bVar2;
  uint uVar3;
  RTPPacket *pRVar4;
  RTPMemoryManager *pRVar5;
  RTPAddress *senderaddress_00;
  RTPTime local_e8;
  RTPTime local_e0;
  RTPAddress *local_d8;
  RTPAddress *senderaddress_1;
  int i_1;
  bool ownpacket_1;
  undefined1 local_c0 [7];
  bool valid;
  RTCPCompoundPacket rtcpcomppack;
  RTPTime local_68;
  RTPAddress *local_60;
  RTPAddress *senderaddress;
  byte local_4e;
  bool local_4d;
  int i;
  bool ownpacket;
  bool stored;
  RTPPacket *local_40;
  RTPPacket *rtppack;
  byte local_2d;
  int status;
  bool acceptownpackets_local;
  RTPTransmitter **ppRStack_28;
  int numtrans_local;
  RTPTransmitter **rtptrans_local;
  RTPRawPacket *rawpack_local;
  RTPSources *this_local;
  
  local_2d = acceptownpackets;
  status = numtrans;
  ppRStack_28 = rtptrans;
  rtptrans_local = (RTPTransmitter **)rawpack;
  rawpack_local = (RTPRawPacket *)this;
  bVar2 = RTPRawPacket::IsRTP(rawpack);
  ppRVar1 = rtptrans_local;
  if (bVar2) {
    pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    pRVar4 = (RTPPacket *)operator_new(0x78,pRVar5,0x19);
    ppRVar1 = rtptrans_local;
    pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPPacket::RTPPacket(pRVar4,(RTPRawPacket *)ppRVar1,pRVar5);
    if (pRVar4 == (RTPPacket *)0x0) {
      return -1;
    }
    local_40 = pRVar4;
    rtppack._4_4_ = RTPPacket::GetCreationError(pRVar4);
    pRVar4 = local_40;
    if (rtppack._4_4_ < 0) {
      if (rtppack._4_4_ != -0x19) {
        pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTPPacket>(pRVar4,pRVar5);
        return rtppack._4_4_;
      }
      pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPPacket>(pRVar4,pRVar5);
      local_40 = (RTPPacket *)0x0;
    }
    if (local_40 == (RTPPacket *)0x0) {
      return 0;
    }
    local_4d = false;
    local_4e = 0;
    local_60 = RTPRawPacket::GetSenderAddress((RTPRawPacket *)rtptrans_local);
    for (senderaddress._4_4_ = 0; pRVar4 = local_40,
        (local_4e & 1) == 0 && senderaddress._4_4_ < status;
        senderaddress._4_4_ = senderaddress._4_4_ + 1) {
      uVar3 = (*(ppRStack_28[senderaddress._4_4_]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                        (ppRStack_28[senderaddress._4_4_],local_60);
      if ((uVar3 & 1) != 0) {
        local_4e = 1;
      }
    }
    if ((local_4e & 1) == 0) {
      rtcpcomppack.rtcppackit._M_node =
           (_List_node_base *)RTPRawPacket::GetReceiveTime((RTPRawPacket *)rtptrans_local);
      rtppack._4_4_ =
           ProcessRTPPacket(this,pRVar4,(RTPTime *)&rtcpcomppack.rtcppackit,local_60,&local_4d);
      pRVar4 = local_40;
      if (rtppack._4_4_ < 0) {
        if ((local_4d & 1U) == 0) {
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTPPacket>(pRVar4,pRVar5);
        }
        return rtppack._4_4_;
      }
    }
    else if ((local_2d & 1) != 0) {
      local_68 = RTPRawPacket::GetReceiveTime((RTPRawPacket *)rtptrans_local);
      rtppack._4_4_ = ProcessRTPPacket(this,pRVar4,&local_68,(RTPAddress *)0x0,&local_4d);
      pRVar4 = local_40;
      if (rtppack._4_4_ < 0) {
        if ((local_4d & 1U) == 0) {
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTPPacket>(pRVar4,pRVar5);
        }
        return rtppack._4_4_;
      }
    }
    pRVar4 = local_40;
    if ((local_4d & 1U) != 0) {
      return 0;
    }
    pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPPacket>(pRVar4,pRVar5);
    return 0;
  }
  pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
  RTCPCompoundPacket::RTCPCompoundPacket
            ((RTCPCompoundPacket *)local_c0,(RTPRawPacket *)ppRVar1,pRVar5);
  ownpacket_1 = false;
  rtppack._4_4_ = RTCPCompoundPacket::GetCreationError((RTCPCompoundPacket *)local_c0);
  if (rtppack._4_4_ < 0) {
    if (rtppack._4_4_ != -0x1e) {
      i_1 = 1;
      this_local._4_4_ = rtppack._4_4_;
      goto LAB_001492b7;
    }
  }
  else {
    ownpacket_1 = true;
  }
  if ((ownpacket_1 & 1U) != 0) {
    senderaddress_1._7_1_ = 0;
    local_d8 = RTPRawPacket::GetSenderAddress((RTPRawPacket *)rtptrans_local);
    for (senderaddress_1._0_4_ = 0;
        (senderaddress_1._7_1_ & 1) == 0 && (int)senderaddress_1 < status;
        senderaddress_1._0_4_ = (int)senderaddress_1 + 1) {
      uVar3 = (*(ppRStack_28[(int)senderaddress_1]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                        (ppRStack_28[(int)senderaddress_1],local_d8);
      if ((uVar3 & 1) != 0) {
        senderaddress_1._7_1_ = 1;
      }
    }
    if ((senderaddress_1._7_1_ & 1) == 0) {
      local_e8 = RTPRawPacket::GetReceiveTime((RTPRawPacket *)rtptrans_local);
      senderaddress_00 = RTPRawPacket::GetSenderAddress((RTPRawPacket *)rtptrans_local);
      rtppack._4_4_ =
           ProcessRTCPCompoundPacket(this,(RTCPCompoundPacket *)local_c0,&local_e8,senderaddress_00)
      ;
      if (rtppack._4_4_ < 0) {
        i_1 = 1;
        this_local._4_4_ = rtppack._4_4_;
        goto LAB_001492b7;
      }
    }
    else if ((local_2d & 1) != 0) {
      local_e0 = RTPRawPacket::GetReceiveTime((RTPRawPacket *)rtptrans_local);
      rtppack._4_4_ =
           ProcessRTCPCompoundPacket
                     (this,(RTCPCompoundPacket *)local_c0,&local_e0,(RTPAddress *)0x0);
      if (rtppack._4_4_ < 0) {
        i_1 = 1;
        this_local._4_4_ = rtppack._4_4_;
        goto LAB_001492b7;
      }
    }
  }
  i_1 = 0;
LAB_001492b7:
  RTCPCompoundPacket::~RTCPCompoundPacket((RTCPCompoundPacket *)local_c0);
  if (i_1 == 0) {
    return 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans[],int numtrans,bool acceptownpackets)
{
	int status;
	
	if (rawpack->IsRTP()) // RTP packet
	{
		RTPPacket *rtppack;
		
		// First, we'll see if the packet can be parsed
		rtppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPACKET) RTPPacket(*rawpack,GetMemoryManager());
		if (rtppack == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = rtppack->GetCreationError()) < 0)
		{
			if (status == ERR_RTP_PACKET_INVALIDPACKET)
			{
				RTPDelete(rtppack,GetMemoryManager());
				rtppack = 0;
			}
			else
			{
				RTPDelete(rtppack,GetMemoryManager());
				return status;
			}
		}
				
		// Check if the packet was valid
		if (rtppack != 0)
		{
			bool stored = false;
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}
			
			// Check if the packet is our own.
			if (ownpacket)
			{
				// Now it depends on the user's preference
				// what to do with this packet:
				if (acceptownpackets)
				{
					// sender addres for own packets has to be NULL!
					if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),0,&stored)) < 0)
					{
						if (!stored)
							RTPDelete(rtppack,GetMemoryManager());
						return status;
					}
				}
			}
			else 
			{
				if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),senderaddress,&stored)) < 0)
				{
					if (!stored)
						RTPDelete(rtppack,GetMemoryManager());
					return status;
				}
			}
			if (!stored)
				RTPDelete(rtppack,GetMemoryManager());
		}
	}
	else // RTCP packet
	{
		RTCPCompoundPacket rtcpcomppack(*rawpack,GetMemoryManager());
		bool valid = false;
		
		if ((status = rtcpcomppack.GetCreationError()) < 0)
		{
			if (status != ERR_RTP_RTCPCOMPOUND_INVALIDPACKET)
				return status;
		}
		else
			valid = true;


		if (valid)
		{
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}

			// First check if it's a packet of this session.
			if (ownpacket)
			{
				if (acceptownpackets)
				{
					// sender address for own packets has to be NULL
					status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),0);
					if (status < 0)
						return status;
				}
			}
			else // not our own packet
			{
				status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),rawpack->GetSenderAddress());
				if (status < 0)
					return status;
			}
		}
	}
	
	return 0;
}